

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage
          (FileGenerator *this,int idx,Printer *printer)

{
  reference pvVar1;
  pointer pMVar2;
  FileGenerator *options;
  Options *extraout_RDX;
  string local_1a0;
  undefined1 local_180 [8];
  NamespaceOpener proto_ns;
  undefined1 local_140 [8];
  NamespaceOpener ns;
  undefined1 local_110 [8];
  CrossFileReferences refs;
  undefined1 local_58 [8];
  Formatter format;
  Printer *printer_local;
  int idx_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_58,printer,&this->variables_);
  GenerateSourceIncludes
            (this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CrossFileReferences::CrossFileReferences((CrossFileReferences *)local_110);
  pvVar1 = std::
           vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ::operator[](&this->message_generators_,(long)idx);
  pMVar2 = std::
           unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
           ::operator->(pvVar1);
  options = this;
  ns.name_stack_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ForEachField<google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage(int,google::protobuf::io::Printer*)::__0>
            (pMVar2->descriptor_,
             (anon_class_16_2_3fe543fb *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  GenerateInternalForwardDeclarations
            (this,(CrossFileReferences *)local_110,
             (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Namespace_abi_cxx11_
            ((string *)
             &proto_ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(cpp *)this->file_,
             (FileDescriptor *)&this->options_,(Options *)options);
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)local_140,
             (string *)
             &proto_ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Formatter *)local_58);
  std::__cxx11::string::~string
            ((string *)
             &proto_ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  GenerateSourceDefaultInstance
            (this,idx,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Formatter::operator()<>((Formatter *)local_58,"\n");
  pvVar1 = std::
           vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ::operator[](&this->message_generators_,(long)idx);
  pMVar2 = std::
           unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
           ::operator->(pvVar1);
  MessageGenerator::GenerateClassMethods
            (pMVar2,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Formatter::operator()<>((Formatter *)local_58,"\n// @@protoc_insertion_point(namespace_scope)\n");
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_140);
  ProtobufNamespace_abi_cxx11_(&local_1a0,(cpp *)&this->options_,extraout_RDX);
  NamespaceOpener::NamespaceOpener((NamespaceOpener *)local_180,&local_1a0,(Formatter *)local_58);
  std::__cxx11::string::~string((string *)&local_1a0);
  pvVar1 = std::
           vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ::operator[](&this->message_generators_,(long)idx);
  pMVar2 = std::
           unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
           ::operator->(pvVar1);
  MessageGenerator::GenerateSourceInProto2Namespace
            (pMVar2,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_180);
  Formatter::operator()<>((Formatter *)local_58,"\n// @@protoc_insertion_point(global_scope)\n");
  CrossFileReferences::~CrossFileReferences((CrossFileReferences *)local_110);
  Formatter::~Formatter((Formatter *)local_58);
  return;
}

Assistant:

void FileGenerator::GenerateSourceForMessage(int idx, io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);

  CrossFileReferences refs;
  ForEachField(message_generators_[idx]->descriptor_,
               [this, &refs](const FieldDescriptor* field) {
                 GetCrossFileReferencesForField(field, &refs);
               });
  GenerateInternalForwardDeclarations(refs, printer);

  {  // package namespace
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Define default instances
    GenerateSourceDefaultInstance(idx, printer);

    // Generate classes.
    format("\n");
    message_generators_[idx]->GenerateClassMethods(printer);

    format(
        "\n"
        "// @@protoc_insertion_point(namespace_scope)\n");
  }  // end package namespace

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
    message_generators_[idx]->GenerateSourceInProto2Namespace(printer);
  }

  format(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");
}